

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_cleanup(CookieInfo *c)

{
  CookieInfo *c_local;
  
  if (c != (CookieInfo *)0x0) {
    (*Curl_cfree)(c->filename);
    Curl_cookie_freelist(c->cookies);
    (*Curl_cfree)(c);
  }
  return;
}

Assistant:

void Curl_cookie_cleanup(struct CookieInfo *c)
{
  if(c) {
    free(c->filename);
    Curl_cookie_freelist(c->cookies);
    free(c); /* free the base struct as well */
  }
}